

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_Blake2s_Simd128.c
# Opt level: O2

void Hacl_Hash_Blake2s_Simd128_update_last
               (uint32_t len,Lib_IntVector_Intrinsics_vec128 *wv,
               Lib_IntVector_Intrinsics_vec128 *hash,uint64_t prev,uint32_t rem,uint8_t *d)

{
  uint8_t b [64];
  
  b[0x30] = '\0';
  b[0x31] = '\0';
  b[0x32] = '\0';
  b[0x33] = '\0';
  b[0x34] = '\0';
  b[0x35] = '\0';
  b[0x36] = '\0';
  b[0x37] = '\0';
  b[0x38] = '\0';
  b[0x39] = '\0';
  b[0x3a] = '\0';
  b[0x3b] = '\0';
  b[0x3c] = '\0';
  b[0x3d] = '\0';
  b[0x3e] = '\0';
  b[0x3f] = '\0';
  b[0x20] = '\0';
  b[0x21] = '\0';
  b[0x22] = '\0';
  b[0x23] = '\0';
  b[0x24] = '\0';
  b[0x25] = '\0';
  b[0x26] = '\0';
  b[0x27] = '\0';
  b[0x28] = '\0';
  b[0x29] = '\0';
  b[0x2a] = '\0';
  b[0x2b] = '\0';
  b[0x2c] = '\0';
  b[0x2d] = '\0';
  b[0x2e] = '\0';
  b[0x2f] = '\0';
  b[0x10] = '\0';
  b[0x11] = '\0';
  b[0x12] = '\0';
  b[0x13] = '\0';
  b[0x14] = '\0';
  b[0x15] = '\0';
  b[0x16] = '\0';
  b[0x17] = '\0';
  b[0x18] = '\0';
  b[0x19] = '\0';
  b[0x1a] = '\0';
  b[0x1b] = '\0';
  b[0x1c] = '\0';
  b[0x1d] = '\0';
  b[0x1e] = '\0';
  b[0x1f] = '\0';
  b[0] = '\0';
  b[1] = '\0';
  b[2] = '\0';
  b[3] = '\0';
  b[4] = '\0';
  b[5] = '\0';
  b[6] = '\0';
  b[7] = '\0';
  b[8] = '\0';
  b[9] = '\0';
  b[10] = '\0';
  b[0xb] = '\0';
  b[0xc] = '\0';
  b[0xd] = '\0';
  b[0xe] = '\0';
  b[0xf] = '\0';
  memcpy(b,d + ((ulong)len - (ulong)rem),(ulong)rem);
  update_block(wv,hash,true,prev + len,b);
  Lib_Memzero0_memzero0(b,0x40);
  return;
}

Assistant:

void
Hacl_Hash_Blake2s_Simd128_update_last(
  uint32_t len,
  Lib_IntVector_Intrinsics_vec128 *wv,
  Lib_IntVector_Intrinsics_vec128 *hash,
  uint64_t prev,
  uint32_t rem,
  uint8_t *d
)
{
  uint8_t b[64U] = { 0U };
  uint8_t *last = d + len - rem;
  memcpy(b, last, rem * sizeof (uint8_t));
  uint64_t totlen = prev + (uint64_t)len;
  update_block(wv, hash, true, totlen, b);
  Lib_Memzero0_memzero(b, 64U, uint8_t, void *);
}